

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int luaL_execresult(lua_State *L,int stat)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  char *s;
  lua_Integer n;
  
  if (stat == 0) {
LAB_0011c056:
    lua_pushboolean(L,1);
    s = "exit";
    n = 0;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      iVar1 = luaL_fileresult(L,0,(char *)0x0);
      return iVar1;
    }
    if ((stat & 0x7fU) == 0) {
      stat = (uint)stat >> 8 & 0xff;
      if (stat == 0) goto LAB_0011c056;
      s = "exit";
    }
    else {
      iVar1 = (stat & 0x7fU) * 0x1000000;
      iVar3 = iVar1 + 0x1000000;
      if (0x1ffffff < iVar3) {
        stat = stat & 0x7fU;
      }
      s = "exit";
      if (SBORROW4(iVar3,0x2000000) == iVar1 + -0x1000000 < 0) {
        s = "signal";
      }
    }
    lua_pushnil(L);
    n = (lua_Integer)stat;
  }
  lua_pushstring(L,s);
  lua_pushinteger(L,n);
  return 3;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  if (stat != 0 && errno != 0)  /* error with an 'errno'? */
    return luaL_fileresult(L, 0, NULL);
  else {
    const char *what = "exit";  /* type of termination */
    l_inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      luaL_pushfail(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/fail,what,code */
  }
}